

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransService.cpp
# Opt level: O0

XMLTranscoder * __thiscall
xercesc_4_0::XMLTransService::makeNewTranscoderFor
          (XMLTransService *this,Encodings encodingEnum,Codes *resValue,XMLSize_t blockSize,
          MemoryManager *manager)

{
  int iVar1;
  ENameMap *pEVar2;
  undefined4 extraout_var;
  XMLCh *pXVar3;
  undefined4 extraout_var_00;
  Codes CVar4;
  XMLTranscoder *temp_1;
  XMLTranscoder *temp;
  ENameMap *ourMapping;
  MemoryManager *manager_local;
  XMLSize_t blockSize_local;
  Codes *resValue_local;
  Encodings encodingEnum_local;
  XMLTransService *this_local;
  
  if (((int)encodingEnum < 0) || (7 < (int)encodingEnum)) {
    *resValue = InternalFailure;
    this_local = (XMLTransService *)0x0;
  }
  else {
    pEVar2 = BaseRefVectorOf<xercesc_4_0::ENameMap>::elementAt
                       (gMappingsRecognizer,(ulong)encodingEnum);
    if (pEVar2 == (ENameMap *)0x0) {
      pXVar3 = XMLRecognizer::nameForEncoding(encodingEnum,manager);
      iVar1 = (*this->_vptr_XMLTransService[9])(this,pXVar3,resValue,blockSize,manager);
      this_local = (XMLTransService *)CONCAT44(extraout_var_00,iVar1);
      if (this_local != (XMLTransService *)0x0) {
        *resValue = Ok;
      }
    }
    else {
      iVar1 = (*pEVar2->_vptr_ENameMap[2])(pEVar2,blockSize,manager);
      this_local = (XMLTransService *)CONCAT44(extraout_var,iVar1);
      CVar4 = InternalFailure;
      if (this_local != (XMLTransService *)0x0) {
        CVar4 = Ok;
      }
      *resValue = CVar4;
    }
  }
  return (XMLTranscoder *)this_local;
}

Assistant:

XMLTranscoder*
XMLTransService::makeNewTranscoderFor(  XMLRecognizer::Encodings        encodingEnum
                                        ,       XMLTransService::Codes& resValue
                                        , const XMLSize_t               blockSize
                                        ,       MemoryManager* const    manager)
{
    //
    // We can only make transcoder if the passed encodingEnum is under this range
    //
    if (encodingEnum < XMLRecognizer::Encodings_Min || encodingEnum > XMLRecognizer::Encodings_Max) {
        resValue = XMLTransService::InternalFailure;
        return 0;
    }

    ENameMap* ourMapping = gMappingsRecognizer->elementAt(encodingEnum);

    // If we found it, then call the factory method for it
    if (ourMapping)    {
       XMLTranscoder* temp = ourMapping->makeNew(blockSize, manager);
       resValue = temp ? XMLTransService::Ok : XMLTransService::InternalFailure;
       return temp;
    }
    else {
        XMLTranscoder* temp =  makeNewXMLTranscoder(XMLRecognizer::nameForEncoding(encodingEnum, manager), resValue, blockSize, manager);

        // if successful, set resValue to OK
        // if failed, the makeNewXMLTranscoder has already set the proper failing resValue
        if (temp) resValue =  XMLTransService::Ok;

        return temp;
    }

}